

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O0

HttpContext<false> * uWS::HttpContext<false>::create(Loop *loop,us_socket_context_options_t options)

{
  int iVar1;
  void *__s;
  undefined4 extraout_var;
  EVP_PKEY_CTX *ctx;
  undefined8 in_RDI;
  HttpContext<false> *httpContext;
  undefined1 local_48 [24];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  HttpContext<false> *local_18;
  HttpContext<false> *local_8;
  
  memcpy(local_48,&stack0x00000008,0x30);
  local_18 = (HttpContext<false> *)us_create_socket_context(0,in_RDI,0xd90);
  if (local_18 == (HttpContext<false> *)0x0) {
    local_8 = (HttpContext<false> *)0x0;
  }
  else {
    __s = (void *)us_socket_context_ext(0);
    ctx = (EVP_PKEY_CTX *)0x0;
    memset(__s,0,0xd90);
    HttpContextData<false>::HttpContextData((HttpContextData<false> *)CONCAT44(uStack_2c,uStack_30))
    ;
    iVar1 = init(local_18,ctx);
    local_8 = (HttpContext<false> *)CONCAT44(extraout_var,iVar1);
  }
  return local_8;
}

Assistant:

static HttpContext *create(Loop *loop, us_socket_context_options_t options = {}) {
        HttpContext *httpContext;

        httpContext = (HttpContext *) us_create_socket_context(SSL, (us_loop_t *) loop, sizeof(HttpContextData<SSL>), options);

        if (!httpContext) {
            return nullptr;
        }

        /* Init socket context data */
        new ((HttpContextData<SSL> *) us_socket_context_ext(SSL, (us_socket_context_t *) httpContext)) HttpContextData<SSL>();
        return httpContext->init();
    }